

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::NamespacePrinterTest_DifferentDelim_Test::
~NamespacePrinterTest_DifferentDelim_Test(NamespacePrinterTest_DifferentDelim_Test *this)

{
  NamespacePrinterTest_DifferentDelim_Test *this_local;
  
  ~NamespacePrinterTest_DifferentDelim_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(NamespacePrinterTest, DifferentDelim) {
  {
    io::Printer printer(output(), '\0');

    const NamespacePrinter namespace_printer(&printer, {"A", "B", "E"});

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "namespace A {\n"
            "namespace B {\n"
            "namespace E {\n"
            "\n"
            "}  // namespace E\n"
            "}  // namespace B\n"
            "}  // namespace A\n");
}